

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int m_id(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  aec_stream_conflict *in_RDI;
  internal_state_conflict *state;
  uint local_4;
  
  piVar1 = in_RDI->state;
  if (piVar1->rsip == piVar1->rsi_buffer) {
    if ((in_RDI->flags & 0x20) != 0) {
      piVar1->bitp = piVar1->bitp - piVar1->bitp % 8;
    }
    if (piVar1->pp != 0) {
      piVar1->ref = 1;
    }
  }
  else {
    piVar1->ref = 0;
  }
  uVar2 = bits_ask(in_RDI,piVar1->id_len);
  if (uVar2 != 0) {
    uVar3 = bits_get(in_RDI,piVar1->id_len);
    piVar1->id = uVar3;
    bits_drop(in_RDI,piVar1->id_len);
    piVar1->mode = piVar1->id_table[piVar1->id];
  }
  local_4 = (uint)(uVar2 != 0);
  return local_4;
}

Assistant:

static int m_id(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (state->rsip == state->rsi_buffer) {
        if(strm->flags & AEC_PAD_RSI)
            state->bitp -= state->bitp % 8;
        if (state->pp)
            state->ref = 1;
    } else {
        state->ref = 0;
    }
    if (bits_ask(strm, state->id_len) == 0)
        return M_EXIT;
    state->id = bits_get(strm, state->id_len);
    bits_drop(strm, state->id_len);
    state->mode = state->id_table[state->id];

    return M_CONTINUE;
}